

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  size_t __n;
  
  __n = ((bits >> 3) + 1) - (ulong)((bits & 7) == 0);
  iVar2 = -0x6c;
  if ((long)((int)__n + 1) <= (long)*p - (long)start) {
    puVar3 = *p + -__n;
    *p = puVar3;
    memcpy(puVar3,buf,__n);
    puVar3 = *p;
    *p = puVar3 + -1;
    puVar3[-1] = (char)((int)__n << 3) - (char)bits;
    iVar1 = mbedtls_asn1_write_len(p,start,__n + 1);
    iVar2 = iVar1;
    if (-1 < iVar1) {
      puVar3 = *p;
      if ((long)puVar3 - (long)start < 1) {
        iVar2 = -0x6c;
      }
      else {
        *p = puVar3 + -1;
        puVar3[-1] = '\x03';
        iVar2 = 1;
      }
      if (puVar3 != start && -1 < (long)puVar3 - (long)start) {
        iVar2 = iVar1 + (int)(__n + 1) + iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_bitstring( unsigned char **p, unsigned char *start,
                          const unsigned char *buf, size_t bits )
{
    int ret;
    size_t len = 0, size;

    size = ( bits / 8 ) + ( ( bits % 8 ) ? 1 : 0 );

    // Calculate byte length
    //
    if( *p - start < (int) size + 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len = size + 1;
    (*p) -= size;
    memcpy( *p, buf, size );

    // Write unused bits
    //
    *--(*p) = (unsigned char) (size * 8 - bits);

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BIT_STRING ) );

    return( (int) len );
}